

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O0

void __thiscall HdlcAnalyzerResults::GenAbortFieldString(HdlcAnalyzerResults *this,bool tabular)

{
  char *local_20;
  char *seq;
  bool tabular_local;
  HdlcAnalyzerResults *this_local;
  
  if (this->mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    local_20 = "(>=7 1-bits)";
  }
  else {
    local_20 = "(0x7D-0x7F)";
  }
  if (tabular) {
    AnalyzerResults::AddTabularText
              ((char *)this,"ABORT SEQUENCE!",local_20,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    AnalyzerResults::AddResultString
              ((char *)this,"AB!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ABORT!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ABORT SEQUENCE!",local_20,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  return;
}

Assistant:

void HdlcAnalyzerResults::GenAbortFieldString( bool tabular )
{
    char* seq = 0;
    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        seq = "(>=7 1-bits)";
    }
    else
    {
        seq = "(0x7D-0x7F)";
    }

    if( !tabular )
    {
        AddResultString( "AB!" );
        AddResultString( "ABORT!" );
        AddResultString( "ABORT SEQUENCE!", seq );
    }
    else
    {
        AddTabularText( "ABORT SEQUENCE!", seq );
    }
}